

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.c
# Opt level: O0

MapcodeError myParseMapcodeString(MapcodeElements *mapcodeElements,char *string,Territory territory)

{
  MapcodeError err;
  double lon;
  double lat;
  char *pcStack_20;
  Territory territory_local;
  char *string_local;
  MapcodeElements *mapcodeElements_local;
  
  lat._4_4_ = territory;
  pcStack_20 = string;
  string_local = mapcodeElements->territoryISO;
  mapcodeElements_local._4_4_ =
       decodeMapcodeToLatLonUtf8
                 (&lon,(double *)&stack0xffffffffffffffc8,string,territory,mapcodeElements);
  if (((mapcodeElements_local._4_4_ == ERR_MISSING_TERRITORY) ||
      (mapcodeElements_local._4_4_ == ERR_MAPCODE_UNDECODABLE)) ||
     (mapcodeElements_local._4_4_ == ERR_EXTENSION_UNDECODABLE)) {
    mapcodeElements_local._4_4_ = ERR_OK;
  }
  return mapcodeElements_local._4_4_;
}

Assistant:

static enum MapcodeError myParseMapcodeString(
        MapcodeElements *mapcodeElements,
        const char *string,
        enum Territory territory) {
    double lat, lon;
    enum MapcodeError err = decodeMapcodeToLatLonUtf8(&lat, &lon, string, territory, mapcodeElements);
    // filter out post-parsing errors
    if (err == ERR_MISSING_TERRITORY || err == ERR_MAPCODE_UNDECODABLE || err == ERR_EXTENSION_UNDECODABLE) {
        return ERR_OK;
    }
    return err;
}